

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.hpp
# Opt level: O2

void __thiscall nite::Console::Result::Result(Result *this,string *msg,Color *color)

{
  (this->msg)._M_dataplus._M_p = (pointer)&(this->msg).field_2;
  (this->msg)._M_string_length = 0;
  (this->msg).field_2._M_local_buf[0] = '\0';
  Color::Color(&this->color);
  std::__cxx11::string::_M_assign((string *)this);
  Color::set(&this->color,color);
  return;
}

Assistant:

Result(const String &msg, const nite::Color &color){
                    this->msg = msg;
                    this->color.set(color);
                }